

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddCollateType(Parse *pParse,Token *pToken)

{
  char *pcVar1;
  short sVar2;
  ushort uVar3;
  Table *pTVar4;
  sqlite3 *db;
  char *zName;
  CollSeq *pCVar5;
  Index *pIVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  
  pTVar4 = pParse->pNewTable;
  if ((pTVar4 != (Table *)0x0) && (pParse->eParseMode < 2)) {
    sVar2 = pTVar4->nCol;
    db = pParse->db;
    zName = sqlite3NameFromToken(db,pToken);
    if (zName != (char *)0x0) {
      pCVar5 = sqlite3LocateCollSeq(pParse,zName);
      if (pCVar5 != (CollSeq *)0x0) {
        lVar9 = (long)sVar2 + -1;
        sqlite3ColumnSetColl(db,pTVar4->aCol + lVar9,zName);
        for (pIVar6 = pTVar4->pIndex; pIVar6 != (Index *)0x0; pIVar6 = pIVar6->pNext) {
          if ((int)lVar9 == (int)*pIVar6->aiColumn) {
            uVar3 = pTVar4->aCol[lVar9].colFlags;
            if ((uVar3 >> 9 & 1) == 0) {
              pcVar7 = (char *)0x0;
            }
            else {
              pcVar7 = pTVar4->aCol[lVar9].zCnName + -1;
              do {
                pcVar8 = pcVar7 + 1;
                pcVar7 = pcVar7 + 1;
              } while (*pcVar8 != '\0');
              pcVar8 = pcVar7;
              if ((uVar3 & 4) != 0) {
                do {
                  pcVar7 = pcVar8 + 1;
                  pcVar1 = pcVar8 + 1;
                  pcVar8 = pcVar7;
                } while (*pcVar1 != '\0');
              }
              pcVar7 = pcVar7 + 1;
            }
            *pIVar6->azColl = pcVar7;
          }
        }
      }
      sqlite3DbFreeNN(db,zName);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCollateType(Parse *pParse, Token *pToken){
  Table *p;
  int i;
  char *zColl;              /* Dequoted name of collation sequence */
  sqlite3 *db;

  if( (p = pParse->pNewTable)==0 || IN_RENAME_OBJECT ) return;
  i = p->nCol-1;
  db = pParse->db;
  zColl = sqlite3NameFromToken(db, pToken);
  if( !zColl ) return;

  if( sqlite3LocateCollSeq(pParse, zColl) ){
    Index *pIdx;
    sqlite3ColumnSetColl(db, &p->aCol[i], zColl);

    /* If the column is declared as "<name> PRIMARY KEY COLLATE <type>",
    ** then an index may have been created on this column before the
    ** collation type was added. Correct this if it is the case.
    */
    for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->nKeyCol==1 );
      if( pIdx->aiColumn[0]==i ){
        pIdx->azColl[0] = sqlite3ColumnColl(&p->aCol[i]);
      }
    }
  }
  sqlite3DbFree(db, zColl);
}